

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O0

void __thiscall
spvtools::opt::Loop::Loop
          (Loop *this,IRContext *context,DominatorAnalysis *dom_analysis,BasicBlock *header,
          BasicBlock *continue_target,BasicBlock *merge_target)

{
  BasicBlock *pBVar1;
  BasicBlock *merge_target_local;
  BasicBlock *continue_target_local;
  BasicBlock *header_local;
  DominatorAnalysis *dom_analysis_local;
  IRContext *context_local;
  Loop *this_local;
  
  this->context_ = context;
  this->loop_header_ = header;
  this->loop_continue_ = continue_target;
  this->loop_merge_ = merge_target;
  this->loop_preheader_ = (BasicBlock *)0x0;
  this->parent_ = (Loop *)0x0;
  std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::vector
            (&this->nested_loops_);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->loop_basic_blocks_);
  this->loop_is_marked_for_removal_ = false;
  if (context == (IRContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                  ,0xd6,
                  "spvtools::opt::Loop::Loop(IRContext *, DominatorAnalysis *, BasicBlock *, BasicBlock *, BasicBlock *)"
                 );
  }
  if (dom_analysis != (DominatorAnalysis *)0x0) {
    pBVar1 = FindLoopPreheader(this,dom_analysis);
    this->loop_preheader_ = pBVar1;
    pBVar1 = FindLatchBlock(this);
    this->loop_latch_ = pBVar1;
    return;
  }
  __assert_fail("dom_analysis",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                ,0xd7,
                "spvtools::opt::Loop::Loop(IRContext *, DominatorAnalysis *, BasicBlock *, BasicBlock *, BasicBlock *)"
               );
}

Assistant:

Loop::Loop(IRContext* context, DominatorAnalysis* dom_analysis,
           BasicBlock* header, BasicBlock* continue_target,
           BasicBlock* merge_target)
    : context_(context),
      loop_header_(header),
      loop_continue_(continue_target),
      loop_merge_(merge_target),
      loop_preheader_(nullptr),
      parent_(nullptr),
      loop_is_marked_for_removal_(false) {
  assert(context);
  assert(dom_analysis);
  loop_preheader_ = FindLoopPreheader(dom_analysis);
  loop_latch_ = FindLatchBlock();
}